

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxStaticArray::Emit(FxStaticArray *this,VMFunctionBuilder *build)

{
  ExpVal *this_00;
  FxExpression **ppFVar1;
  FxStaticArray *pFVar2;
  int iVar3;
  uint uVar4;
  ExpEmit EVar5;
  long lVar6;
  TArray<int,_int> cvalues;
  TArray<FString,_FString> local_68;
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  FxStaticArray *local_40;
  VMFunctionBuilder *local_38;
  
  local_40 = this;
  local_38 = build;
  switch(this->ElementType->RegType) {
  case '\0':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar1 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar4 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    for (lVar6 = 0; (ulong)uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
      ExpVal::ExpVal((ExpVal *)(local_58 + 8),(ExpVal *)(*(long *)((long)ppFVar1 + lVar6) + 0x28));
      if (*(char *)(local_58._8_8_ + 0x6b) == '\x01') {
        iVar3 = (int)(double)CONCAT44(uStack_44,local_48);
      }
      else {
        iVar3 = 0;
        if (*(char *)(local_58._8_8_ + 0x6b) == '\0') {
          iVar3 = local_48;
        }
      }
      local_58._0_4_ = iVar3;
      TArray<int,_int>::Push((TArray<int,_int> *)&local_68,(int *)local_58);
      ExpVal::~ExpVal((ExpVal *)(local_58 + 8));
    }
    uVar4 = VMFunctionBuilder::AllocConstantsInt(local_38,local_68.Count,(int *)local_68.Array);
    (local_40->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<int,_int>::~TArray((TArray<int,_int> *)&local_68);
    break;
  case '\x01':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar1 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar4 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    this_00 = (ExpVal *)(local_58 + 8);
    for (lVar6 = 0; (ulong)uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
      ExpVal::ExpVal(this_00,(ExpVal *)(*(long *)((long)ppFVar1 + lVar6) + 0x28));
      local_58._0_8_ = ExpVal::GetFloat(this_00);
      TArray<double,_double>::Push((TArray<double,_double> *)&local_68,(double *)local_58);
      ExpVal::~ExpVal(this_00);
    }
    uVar4 = VMFunctionBuilder::AllocConstantsFloat(local_38,local_68.Count,(double *)local_68.Array)
    ;
    (local_40->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<double,_double>::~TArray((TArray<double,_double> *)&local_68);
    break;
  case '\x02':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar1 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar4 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    for (lVar6 = 0; (ulong)uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
      ExpVal::ExpVal((ExpVal *)(local_58 + 8),(ExpVal *)(*(long *)((long)ppFVar1 + lVar6) + 0x28));
      ExpVal::GetString((ExpVal *)local_58);
      TArray<FString,_FString>::Push(&local_68,(FString *)local_58);
      FString::~FString((FString *)local_58);
      ExpVal::~ExpVal((ExpVal *)(local_58 + 8));
    }
    uVar4 = VMFunctionBuilder::AllocConstantsString(local_38,local_68.Count,local_68.Array);
    (local_40->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<FString,_FString>::~TArray(&local_68);
    break;
  case '\x03':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar1 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar4 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    for (lVar6 = 0; pFVar2 = local_40, (ulong)uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
      ExpVal::ExpVal((ExpVal *)(local_58 + 8),(ExpVal *)(*(long *)((long)ppFVar1 + lVar6) + 0x28));
      if (*(char *)(local_58._8_8_ + 0x6b) == '\x03') {
        local_58._0_8_ = CONCAT44(uStack_44,local_48);
      }
      else {
        local_58._0_8_ = (PType *)0x0;
      }
      TArray<void_*,_void_*>::Push((TArray<void_*,_void_*> *)&local_68,(void **)local_58);
      ExpVal::~ExpVal((ExpVal *)(local_58 + 8));
    }
    uVar4 = VMFunctionBuilder::AllocConstantsAddress
                      (local_38,local_68.Count,&(local_68.Array)->Chars,
                       local_40->ElementType->loadOp == '\x1c');
    (pFVar2->super_FxLocalVariableDeclaration).StackOffset = uVar4;
    TArray<void_*,_void_*>::~TArray((TArray<void_*,_void_*> *)&local_68);
    break;
  default:
    __assert_fail("false && \"Invalid register type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2789,"virtual ExpEmit FxStaticArray::Emit(VMFunctionBuilder *)");
  }
  EVar5.RegNum = 0;
  EVar5.RegType = 0x80;
  EVar5.RegCount = '\x01';
  EVar5.Konst = false;
  EVar5.Fixed = false;
  EVar5.Final = false;
  EVar5.Target = false;
  return EVar5;
}

Assistant:

ExpEmit FxStaticArray::Emit(VMFunctionBuilder *build)
{
	switch (ElementType->GetRegType())
	{
	default:
		assert(false && "Invalid register type");
		break;

	case REGT_INT:
	{
		TArray<int> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetInt());
		StackOffset = build->AllocConstantsInt(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_FLOAT:
	{
		TArray<double> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetFloat());
		StackOffset = build->AllocConstantsFloat(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_STRING:
	{
		TArray<FString> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetString());
		StackOffset = build->AllocConstantsString(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_POINTER:
	{
		TArray<void*> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetPointer());
		StackOffset = build->AllocConstantsAddress(cvalues.Size(), &cvalues[0], ElementType->GetLoadOp() == OP_LO ? ATAG_OBJECT : ATAG_GENERIC);
		break;
	}
	}
	return ExpEmit();
}